

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6MinimumBase(word uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  int iVar1;
  uint local_3c;
  int local_38;
  int uSupp;
  int iVar;
  int v;
  int *pnVars_local;
  int nVarsAll_local;
  int *pSupp_local;
  word uTruth_local;
  
  local_38 = 0;
  local_3c = 0;
  if (6 < nVarsAll) {
    __assert_fail("nVarsAll <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x203,"word If_Dec6MinimumBase(word, int *, int, int *)");
  }
  for (uSupp = 0; uSupp < nVarsAll; uSupp = uSupp + 1) {
    iVar1 = If_Dec6HasVar(uTruth,uSupp);
    if (iVar1 != 0) {
      local_3c = 1 << ((byte)uSupp & 0x1f) | local_3c;
      if (pSupp != (int *)0x0) {
        pSupp[local_38] = pSupp[uSupp];
      }
      local_38 = local_38 + 1;
    }
  }
  if (pnVars != (int *)0x0) {
    *pnVars = local_38;
  }
  iVar1 = If_DecSuppIsMinBase(local_3c);
  uTruth_local = uTruth;
  if (iVar1 == 0) {
    uTruth_local = If_Dec6TruthShrink(uTruth,local_38,nVarsAll,local_3c);
  }
  return uTruth_local;
}

Assistant:

word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 6 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec6HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return uTruth;
    return If_Dec6TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}